

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.hpp
# Opt level: O0

bool jsonip::parse<jsonip::value>(value *t,istream *is)

{
  bool bVar1;
  undefined1 local_a8 [8];
  state st;
  IStreamReader local_58;
  IStreamReader reader;
  holder local_48;
  state_t local_40;
  undefined1 local_30 [8];
  semantic_state ss;
  istream *is_local;
  value *t_local;
  
  ss.state.
  super__Vector_base<std::pair<jsonip::holder,_const_jsonip::helper_*>,_std::allocator<std::pair<jsonip::holder,_const_jsonip::helper_*>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)is;
  holder::holder<jsonip::value>(&local_48,t);
  reader.in_ = (istream *)detail::get_helper<jsonip::value>(t);
  std::make_pair<jsonip::holder,jsonip::helper_const*>(&local_40.first,(helper **)&local_48);
  semantic_state::semantic_state((semantic_state *)local_30,&local_40);
  parser::IStreamReader::IStreamReader
            (&local_58,
             (istream *)
             ss.state.
             super__Vector_base<std::pair<jsonip::holder,_const_jsonip::helper_*>,_std::allocator<std::pair<jsonip::holder,_const_jsonip::helper_*>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage);
  parser::ReaderState<jsonip::semantic_state,_jsonip::parser::IStreamReader>::ReaderState
            ((ReaderState<jsonip::semantic_state,_jsonip::parser::IStreamReader> *)local_a8,
             (semantic_state *)local_30,&local_58);
  bVar1 = parser::
          or_<jsonip::parser::seq_<jsonip::grammar::spaces_,jsonip::grammar::atom,jsonip::grammar::spaces_,jsonip::parser::identity<true>,jsonip::parser::identity<true>,jsonip::parser::identity<true>,jsonip::parser::identity<true>,jsonip::parser::identity<true>>,jsonip::parser::identity<true>,jsonip::parser::identity<false>,jsonip::parser::identity<false>,jsonip::parser::identity<false>,jsonip::parser::identity<false>,jsonip::parser::identity<false>,jsonip::parser::identity<false>>
          ::match<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::IStreamReader>>
                    ((ReaderState<jsonip::semantic_state,_jsonip::parser::IStreamReader> *)local_a8)
  ;
  parser::ReaderState<jsonip::semantic_state,_jsonip::parser::IStreamReader>::~ReaderState
            ((ReaderState<jsonip::semantic_state,_jsonip::parser::IStreamReader> *)local_a8);
  semantic_state::~semantic_state((semantic_state *)local_30);
  return bVar1;
}

Assistant:

bool parse(T& t, std::istream& is)
    {
        typedef parser::ReaderState<semantic_state, parser::IStreamReader> state;
        semantic_state ss(std::make_pair(holder(&t), detail::get_helper(t)));
        parser::IStreamReader reader(is);
        state st(ss, reader);

        return jsonip::grammar::gram::match(st);
    }